

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>::alloc
          (array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
           *this,int new_len)

{
  CRuleCondition *pCVar1;
  undefined1 auVar2 [16];
  int iVar3;
  CRuleCondition *pCVar4;
  long lVar5;
  ulong uVar6;
  
  this->list_size = new_len;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)new_len;
  uVar6 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0xc),8) == 0) {
    uVar6 = SUB168(auVar2 * ZEXT816(0xc),0);
  }
  pCVar4 = (CRuleCondition *)operator_new__(uVar6);
  if (this->num_elements < new_len) {
    new_len = this->num_elements;
  }
  if (0 < new_len) {
    pCVar1 = this->list;
    lVar5 = 0;
    do {
      *(undefined4 *)((long)&pCVar4->m_Value + lVar5) =
           *(undefined4 *)((long)&pCVar1->m_Value + lVar5);
      *(undefined8 *)((long)&pCVar4->m_X + lVar5) = *(undefined8 *)((long)&pCVar1->m_X + lVar5);
      lVar5 = lVar5 + 0xc;
    } while ((ulong)(uint)new_len * 0xc != lVar5);
  }
  if (this->list != (CRuleCondition *)0x0) {
    operator_delete__(this->list);
  }
  iVar3 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar3 = this->num_elements;
  }
  this->num_elements = iVar3;
  this->list = pCVar4;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}